

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pmulhh_mips64(uint64_t fs,uint64_t ft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = fs;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ft;
  auVar1 = pmulhw(auVar2,auVar1);
  return auVar1._0_8_;
}

Assistant:

uint64_t helper_pmulhh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int32_t r = vs.sh[i] * vt.sh[i];
        vs.sh[i] = r >> 16;
    }
    return vs.d;
}